

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void duckdb::QuantileOperation::
     WindowInit<duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,signed_char>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               data_ptr_t g_state)

{
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_> __p;
  tuple<duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_> in_RAX;
  WindowQuantileState<signed_char> *this;
  __uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_> local_28
  ;
  
  lVar1 = (partition->stats)._M_elems[1].begin;
  lVar2 = (partition->stats)._M_elems[0].end;
  if ((lVar1 < lVar2) ||
     ((double)(lVar1 - lVar2) /
      (double)((partition->stats)._M_elems[1].end - (partition->stats)._M_elems[0].begin) <= 0.75))
  {
    local_28._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
    .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl =
         (tuple<duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>)
         (tuple<duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>)
         in_RAX.
         super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
         .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl;
    this = QuantileState<signed_char,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                     ((QuantileState<signed_char,_duckdb::QuantileStandardType> *)g_state);
    make_uniq<duckdb::QuantileSortTree,duckdb::AggregateInputData&,duckdb::WindowPartitionInput_const&>
              ((duckdb *)&local_28,aggr_input_data,partition);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
    .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl =
         local_28._M_t.
         super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
         .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl;
    local_28._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
    .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl =
         (tuple<duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>)
         (_Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
          )0x0;
    ::std::__uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
    ::reset((__uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
             *)this,(pointer)__p._M_t.
                             super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
                             .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false>._M_head_impl)
    ;
    ::std::unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>::
    ~unique_ptr((unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
                 *)&local_28);
  }
  return;
}

Assistant:

static void WindowInit(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                       data_ptr_t g_state) {
		D_ASSERT(partition.inputs);

		const auto &stats = partition.stats;

		//	If frames overlap significantly, then use local skip lists.
		if (stats[0].end <= stats[1].begin) {
			//	Frames can overlap
			const auto overlap = double(stats[1].begin - stats[0].end);
			const auto cover = double(stats[1].end - stats[0].begin);
			const auto ratio = overlap / cover;
			if (ratio > .75) {
				return;
			}
		}

		//	Build the tree
		auto &state = *reinterpret_cast<STATE *>(g_state);
		auto &window_state = state.GetOrCreateWindowState();
		window_state.qst = make_uniq<QuantileSortTree>(aggr_input_data, partition);
	}